

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinproc.c
# Opt level: O2

void nn_cinproc_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  uint uVar1;
  ulong uVar2;
  char *pcVar3;
  int name;
  ulong uVar4;
  undefined8 uVar5;
  
  uVar4 = (ulong)(uint)src;
  uVar1 = *(uint *)&self[1].fn;
  uVar2 = (ulong)uVar1;
  if (uVar1 == 3) {
    if (src == 1) {
      if (type == 6) {
        *(undefined4 *)&self[1].fn = 2;
        nn_epbase_stat_increment((nn_epbase *)&self[1].shutdown_fn,0xca,1);
        nn_sinproc_init((nn_sinproc *)&self[1].stopped,1,(nn_epbase *)&self[1].shutdown_fn,self);
        return;
      }
      pcVar3 = "Unexpected action";
      uVar2 = 3;
      uVar4 = 1;
      uVar5 = 0xec;
    }
    else {
      pcVar3 = "Unexpected source";
      uVar2 = 3;
      uVar5 = 0xf0;
    }
    goto LAB_0011fe13;
  }
  if (uVar1 != 2) {
    if (uVar1 == 1) {
      if (src == -2) {
        if (type == -2) {
          *(undefined4 *)&self[1].fn = 2;
          name = 0xca;
          goto LAB_0011fcc8;
        }
        pcVar3 = "Unexpected action";
        uVar2 = 1;
        uVar4 = 0xfffffffffffffffe;
        uVar5 = 0xae;
      }
      else {
        pcVar3 = "Unexpected source";
        uVar2 = 1;
        uVar5 = 0xb2;
      }
    }
    else {
      pcVar3 = "Unexpected state";
      uVar5 = 0xf7;
    }
LAB_0011fe13:
    fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n",pcVar3,uVar2,uVar4,
            (ulong)(uint)type,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/inproc/cinproc.c"
            ,uVar5);
    fflush(_stderr);
    nn_err_abort();
  }
  if (src == 0x6c41) {
    if (type != 1) {
      pcVar3 = "Unexpected action";
      uVar2 = 2;
      uVar4 = 0x6c41;
      uVar5 = 0xd4;
      goto LAB_0011fe13;
    }
    nn_sinproc_accept((nn_sinproc *)&self[1].stopped,(nn_sinproc *)srcptr);
  }
  else {
    if (src != -2) {
      pcVar3 = "Unexpected source";
      uVar2 = 2;
      uVar5 = 0xd8;
      goto LAB_0011fe13;
    }
    if (type != 1) {
      pcVar3 = "Unexpected action";
      uVar2 = 2;
      uVar4 = 0xfffffffffffffffe;
      uVar5 = 0xc5;
      goto LAB_0011fe13;
    }
  }
  *(undefined4 *)&self[1].fn = 3;
  nn_epbase_stat_increment((nn_epbase *)&self[1].shutdown_fn,0xca,-1);
  name = 0x65;
LAB_0011fcc8:
  nn_epbase_stat_increment((nn_epbase *)&self[1].shutdown_fn,name,1);
  return;
}

Assistant:

static void nn_cinproc_handler (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_cinproc *cinproc;
    struct nn_sinproc *sinproc;

    cinproc = nn_cont (self, struct nn_cinproc, fsm);


    switch (cinproc->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_CINPROC_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                cinproc->state = NN_CINPROC_STATE_DISCONNECTED;
                nn_epbase_stat_increment (&cinproc->item.epbase,
                    NN_STAT_INPROGRESS_CONNECTIONS, 1);
                return;
            default:
                nn_fsm_bad_action (cinproc->state, src, type);
            }

        default:
            nn_fsm_bad_source (cinproc->state, src, type);
        }

/******************************************************************************/
/*  DISCONNECTED state.                                                       */
/******************************************************************************/
    case NN_CINPROC_STATE_DISCONNECTED:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_CINPROC_ACTION_CONNECT:
                cinproc->state = NN_CINPROC_STATE_ACTIVE;
                nn_epbase_stat_increment (&cinproc->item.epbase,
                    NN_STAT_INPROGRESS_CONNECTIONS, -1);
                nn_epbase_stat_increment (&cinproc->item.epbase,
                    NN_STAT_ESTABLISHED_CONNECTIONS, 1);
                return;
            default:
                nn_fsm_bad_action (cinproc->state, src, type);
            }

        case NN_SINPROC_SRC_PEER:
            sinproc = (struct nn_sinproc*) srcptr;
            switch (type) {
            case NN_SINPROC_CONNECT:
                nn_sinproc_accept (&cinproc->sinproc, sinproc);
                cinproc->state = NN_CINPROC_STATE_ACTIVE;
                nn_epbase_stat_increment (&cinproc->item.epbase,
                    NN_STAT_INPROGRESS_CONNECTIONS, -1);
                nn_epbase_stat_increment (&cinproc->item.epbase,
                    NN_STAT_ESTABLISHED_CONNECTIONS, 1);
                return;
            default:
                nn_fsm_bad_action (cinproc->state, src, type);
            }

        default:
            nn_fsm_bad_source (cinproc->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_CINPROC_STATE_ACTIVE:
        switch (src) {
        case NN_CINPROC_SRC_SINPROC:
            switch (type) {
            case NN_SINPROC_DISCONNECT:
                cinproc->state = NN_CINPROC_STATE_DISCONNECTED;
                nn_epbase_stat_increment (&cinproc->item.epbase,
                    NN_STAT_INPROGRESS_CONNECTIONS, 1);

                nn_sinproc_init (&cinproc->sinproc, NN_CINPROC_SRC_SINPROC,
                    &cinproc->item.epbase, &cinproc->fsm);
                return;

            default:
                nn_fsm_bad_action (cinproc->state, src, type);
            }

        default:
            nn_fsm_bad_source (cinproc->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (cinproc->state, src, type);
    }
}